

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O0

void __thiscall
SchemePrimitiveProcedure::SchemePrimitiveProcedure
          (SchemePrimitiveProcedure *this,string *name_,longlong minargs,longlong maxargs)

{
  longlong maxargs_local;
  longlong minargs_local;
  string *name__local;
  SchemePrimitiveProcedure *this_local;
  
  SchemeProcedure::SchemeProcedure(&this->super_SchemeProcedure);
  (this->super_SchemeProcedure).super_SchemeObject._vptr_SchemeObject =
       (_func_int **)&PTR__SchemePrimitiveProcedure_002457a0;
  std::__cxx11::string::operator=((string *)&(this->super_SchemeProcedure).name,(string *)name_);
  (this->super_SchemeProcedure).arity.first = minargs;
  (this->super_SchemeProcedure).arity.second = maxargs;
  return;
}

Assistant:

SchemePrimitiveProcedure(const std::string &name_, long long minargs, long long maxargs)
    {
        name = name_;
        arity.first = minargs;
        arity.second = maxargs;
    }